

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

void IDAAhermiteFree(IDAMem IDA_mem)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  long in_RDI;
  long i;
  IDAhermiteDataMem content;
  IDAdtpntMem *dt_mem;
  IDAadjMem IDAADJ_mem;
  long local_28;
  
  lVar1 = *(long *)(in_RDI + 0x840);
  N_VDestroy(*(undefined8 *)(lVar1 + 0x158));
  N_VDestroy(*(undefined8 *)(lVar1 + 0x160));
  if (*(int *)(lVar1 + 0xb8) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(lVar1 + 0x168),*(undefined4 *)(in_RDI + 0xa0));
    N_VDestroyVectorArray(*(undefined8 *)(lVar1 + 0x170),*(undefined4 *)(in_RDI + 0xa0));
  }
  lVar2 = *(long *)(lVar1 + 0x78);
  for (local_28 = 0; local_28 <= *(long *)(lVar1 + 0x68); local_28 = local_28 + 1) {
    puVar3 = *(undefined8 **)(*(long *)(lVar2 + local_28 * 8) + 8);
    if (puVar3 != (undefined8 *)0x0) {
      N_VDestroy(*puVar3);
      N_VDestroy(puVar3[1]);
      if (*(int *)(lVar1 + 0xb8) != 0) {
        N_VDestroyVectorArray(puVar3[2],*(undefined4 *)(in_RDI + 0xa0));
        N_VDestroyVectorArray(puVar3[3],*(undefined4 *)(in_RDI + 0xa0));
      }
      free(*(void **)(*(long *)(lVar2 + local_28 * 8) + 8));
      *(undefined8 *)(*(long *)(lVar2 + local_28 * 8) + 8) = 0;
    }
  }
  return;
}

Assistant:

static void IDAAhermiteFree(IDAMem IDA_mem)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDAhermiteDataMem content;
  long int i;

  IDAADJ_mem = IDA_mem->ida_adj_mem;

  N_VDestroy(IDAADJ_mem->ia_yyTmp);
  N_VDestroy(IDAADJ_mem->ia_ypTmp);

  if (IDAADJ_mem->ia_storeSensi)
  {
    N_VDestroyVectorArray(IDAADJ_mem->ia_yySTmp, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDAADJ_mem->ia_ypSTmp, IDA_mem->ida_Ns);
  }

  dt_mem = IDAADJ_mem->dt_mem;

  for (i = 0; i <= IDAADJ_mem->ia_nsteps; i++)
  {
    content = (IDAhermiteDataMem)(dt_mem[i]->content);
    /* content might be NULL, if IDAAdjInit was called but IDASolveF was not. */
    if (content)
    {
      N_VDestroy(content->y);
      N_VDestroy(content->yd);

      if (IDAADJ_mem->ia_storeSensi)
      {
        N_VDestroyVectorArray(content->yS, IDA_mem->ida_Ns);
        N_VDestroyVectorArray(content->ySd, IDA_mem->ida_Ns);
      }
      free(dt_mem[i]->content);
      dt_mem[i]->content = NULL;
    }
  }
}